

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

expression_ptr __thiscall mjs::parser::parse_postfix_expression(parser *this)

{
  undefined4 uVar1;
  bool bVar2;
  wostream *pwVar3;
  socklen_t *in_RCX;
  wstring_view *s;
  parser *in_RSI;
  wchar_t *in_R9;
  wstring_view message;
  undefined1 local_1e0 [12];
  token_type t;
  undefined1 local_1d0 [40];
  undefined1 local_1a8 [24];
  wostringstream _oss;
  
  parse_left_hand_side_expression((parser *)local_1e0);
  if (in_RSI->line_break_skipped_ == true) {
LAB_0016a9eb:
    (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_1e0._0_8_;
  }
  else {
    t = (in_RSI->current_token_).type_;
    accept((parser *)&_oss,(int)in_RSI,(sockaddr *)0x11,in_RCX);
    if (__oss == 0x72) {
      accept((parser *)local_1d0,(int)in_RSI,(sockaddr *)0x12,in_RCX);
      uVar1 = local_1d0._0_4_;
      token::destroy((token *)local_1d0);
      token::destroy((token *)&_oss);
      if (uVar1 == 0x72) goto LAB_0016a9eb;
    }
    else {
      token::destroy((token *)&_oss);
    }
    if ((in_RSI->strict_mode_ == true) &&
       (bVar2 = is_strict_mode_unassignable_identifier((expression *)local_1e0._0_8_), bVar2)) {
      std::__cxx11::wostringstream::wostringstream((wostringstream *)&_oss);
      pwVar3 = std::operator<<((wostream *)&_oss,"\"");
      local_1a8._8_8_ = *(uint64_t *)((long)&((wstring *)(local_1e0._0_8_ + 8))->field_2 + 8);
      local_1a8._0_8_ = (((wstring *)(local_1e0._0_8_ + 0x28))->_M_dataplus)._M_p;
      cpp_quote_abi_cxx11_((wstring *)local_1d0,(mjs *)local_1a8,s);
      pwVar3 = std::operator<<(pwVar3,(wstring *)local_1d0);
      std::operator<<(pwVar3,"\" may not be modified in strict mode");
      std::__cxx11::wstring::~wstring((wstring *)local_1d0);
      current_extend((source_extend *)local_1a8,in_RSI);
      std::__cxx11::wstringbuf::str();
      message._M_len._4_4_ = local_1d0._4_4_;
      message._M_len._0_4_ = local_1d0._0_4_;
      message._M_str = in_R9;
      syntax_error((parser *)"parse_postfix_expression",(char *)0x229,(int)local_1a8,
                   (source_extend *)local_1d0._8_8_,message);
    }
    make_expression<mjs::postfix_expression,mjs::token_type&,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
              (this,(token_type *)in_RSI,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)&t);
    if ((element_type *)local_1e0._0_8_ != (element_type *)0x0) {
      (**(code **)(*(long *)local_1e0._0_8_ + 8))();
    }
  }
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
}

Assistant:

expression_ptr parse_postfix_expression() {
        auto lhs = parse_left_hand_side_expression();
        // no line break before
        if (line_break_skipped_) {
            return lhs;
        }
        if (auto t = current_token_type(); accept(token_type::plusplus) || accept(token_type::minusminus)) {
            if (strict_mode_ && is_strict_mode_unassignable_identifier(*lhs)) {
                SYNTAX_ERROR("\"" << cpp_quote(static_cast<const identifier_expression&>(*lhs).id()) << "\" may not be modified in strict mode");
            }
            return make_expression<postfix_expression>(t, std::move(lhs));
        }
        return lhs;
    }